

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderPrimitiveCounter.cpp
# Opt level: O0

bool __thiscall
glcts::GeometryShaderPrimitiveCounter::checkResult(GeometryShaderPrimitiveCounter *this,GLint *data)

{
  TestLog *this_00;
  MessageBuilder *pMVar1;
  uint local_1b8 [4];
  MessageBuilder local_1a8;
  uint local_28;
  uint local_24;
  uint nValue;
  uint nEmittedValuesPerPrimitive;
  uint nDrawnPrimitive;
  bool testPassed;
  GLint *data_local;
  GeometryShaderPrimitiveCounter *this_local;
  
  nEmittedValuesPerPrimitive._3_1_ = true;
  _nDrawnPrimitive = data;
  data_local = (GLint *)this;
  for (nValue = 0; nValue < (this->m_testConfiguration).m_numberOfDrawnPrimitives;
      nValue = nValue + 1) {
    local_24 = this->m_maxGeometryOutputVertices * this->m_nrVaryings;
    for (local_28 = local_24 * nValue; local_28 < local_24 * (nValue + 1); local_28 = local_28 + 1)
    {
      if (_nDrawnPrimitive[local_28] != nValue) {
        this_00 = tcu::TestContext::getLog
                            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_1a8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar1 = tcu::MessageBuilder::operator<<
                           (&local_1a8,(char (*) [25])"Rendered value at index ");
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2c316fc);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_28);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2ba4f58);
        local_1b8[0] = (this->m_testConfiguration).m_numberOfDrawnPrimitives *
                       this->m_maxGeometryOutputVertices * this->m_nrVaryings;
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,local_1b8);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [4])0x2a5b729);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,_nDrawnPrimitive + local_28);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [5])0x2a1de65);
        pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_24);
        tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1a8);
        nEmittedValuesPerPrimitive._3_1_ = false;
      }
    }
  }
  return (bool)nEmittedValuesPerPrimitive._3_1_;
}

Assistant:

bool GeometryShaderPrimitiveCounter::checkResult(const glw::GLint* data)
{
	bool testPassed = true;

	for (unsigned int nDrawnPrimitive = 0; nDrawnPrimitive < m_testConfiguration.m_numberOfDrawnPrimitives;
		 nDrawnPrimitive++)
	{
		unsigned int nEmittedValuesPerPrimitive = m_maxGeometryOutputVertices * m_nrVaryings;

		for (unsigned int nValue = (nEmittedValuesPerPrimitive * (nDrawnPrimitive));
			 nValue < (nEmittedValuesPerPrimitive * (nDrawnPrimitive + 1)); nValue++)
		{
			if ((unsigned int)data[nValue] != nDrawnPrimitive)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Rendered value at index "
								   << "[" << nValue << "/" << (m_testConfiguration.m_numberOfDrawnPrimitives *
															   m_maxGeometryOutputVertices * m_nrVaryings)
								   << "]: " << data[nValue] << " != " << nEmittedValuesPerPrimitive
								   << tcu::TestLog::EndMessage;

				testPassed = false;
			}
		} /* for (all values) */
	}	 /* for (all primitives) */

	return testPassed;
}